

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O0

void __thiscall shared_ptr_empty_ptr_Test::TestBody(shared_ptr_empty_ptr_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  shared_ptr_empty_ptr_Test *this_local;
  Message local_4d8;
  Struct *local_4d0;
  void *local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_25;
  Message local_4a8;
  long local_4a0;
  undefined4 local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_24;
  Message local_478;
  bool local_46a;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_23;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_22;
  Message local_428;
  Struct *local_420;
  void *local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_21;
  Message local_3f8;
  long local_3f0;
  undefined4 local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_20;
  Message local_3c8;
  bool local_3ba;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_19;
  Message local_3a0;
  Struct *local_398;
  void *local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_18;
  Message local_370;
  long local_368;
  undefined4 local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_17;
  Message local_340;
  bool local_332;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_16;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_15;
  undefined1 local_2e8 [8];
  shared_ptr<Struct> zPtr;
  Message local_2d0;
  Struct *local_2c8;
  void *local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_14;
  Message local_2a0;
  long local_298;
  undefined4 local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_13;
  Message local_270;
  bool local_262;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_12;
  Message local_248;
  Struct *local_240;
  void *local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_11;
  Message local_218;
  long local_210;
  undefined4 local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_10;
  Message local_1e8;
  bool local_1da;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_9;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_8;
  shared_ptr<Struct> yPtr;
  Message local_188;
  Struct *local_180;
  void *local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_7;
  Message local_158;
  long local_150;
  undefined4 local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_6;
  Message local_128;
  bool local_11a;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  AssertHelper local_d0;
  Message local_c8;
  Struct *local_c0;
  void *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  long local_90;
  undefined4 local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  bool local_5a;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  shared_ptr<Struct> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)&gtest_ar.message_);
  local_31 = false;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
            ((EqHelper<false> *)local_30,"false","xPtr",&local_31,
             (shared_ptr<Struct> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_59 = false;
  local_5a = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_58,"false","xPtr.unique()",&local_59,&local_5a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = 0;
  local_90 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,long>
            (local_80,"0",(int *)"xPtr.use_count()",(long *)&local_84,&local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = (void *)0x0;
  local_c0 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<void*,Struct*>
            ((EqHelper<false> *)local_b0,"(void*)__null","xPtr.get()",&local_b8,&local_c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bVar2 = shared_ptr::operator_cast_to_bool((shared_ptr *)&gtest_ar.message_);
  if (bVar2) {
    testing::Message::Message(&local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x39,"bool cast operator error");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  else {
    shared_ptr<Struct>::reset((shared_ptr<Struct> *)&gtest_ar.message_);
    local_f1 = false;
    testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
              ((EqHelper<false> *)local_f0,"false","xPtr",&local_f1,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar2) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x3f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    local_119 = false;
    local_11a = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_118,"false","xPtr.unique()",&local_119,&local_11a);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar2) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x40,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    local_144 = 0;
    local_150 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_140,"0",(int *)"xPtr.use_count()",(long *)&local_144,&local_150);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar2) {
      testing::Message::Message(&local_158);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x41,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    local_178 = (void *)0x0;
    local_180 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_170,"(void*)__null","xPtr.get()",&local_178,&local_180);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar2) {
      testing::Message::Message(&local_188);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&yPtr.px,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x42,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&yPtr.px,&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&yPtr.px);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    shared_ptr<Struct>::shared_ptr
              ((shared_ptr<Struct> *)&gtest_ar_8.message_,(shared_ptr<Struct> *)&gtest_ar.message_);
    local_1b1 = false;
    testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
              ((EqHelper<false> *)local_1b0,"false","xPtr",&local_1b1,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar2) {
      testing::Message::Message(&local_1c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x49,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    local_1d9 = false;
    local_1da = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_1d8,"false","xPtr.unique()",&local_1d9,&local_1da);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar2) {
      testing::Message::Message(&local_1e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    local_204 = 0;
    local_210 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_200,"0",(int *)"xPtr.use_count()",(long *)&local_204,&local_210);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
    if (!bVar2) {
      testing::Message::Message(&local_218);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_218);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
    local_238 = (void *)0x0;
    local_240 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_230,"(void*)__null","xPtr.get()",&local_238,&local_240);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar2) {
      testing::Message::Message(&local_248);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_248);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    local_261 = false;
    local_262 = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar_8.message_);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_260,"false","yPtr.unique()",&local_261,&local_262);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar2) {
      testing::Message::Message(&local_270);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_270);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    local_28c = 0;
    local_298 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar_8.message_);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_288,"0",(int *)"yPtr.use_count()",(long *)&local_28c,&local_298);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar2) {
      testing::Message::Message(&local_2a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    local_2c0 = (void *)0x0;
    local_2c8 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar_8.message_);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_2b8,"(void*)__null","yPtr.get()",&local_2c0,&local_2c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar2) {
      testing::Message::Message(&local_2d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&zPtr.px,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&zPtr.px,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zPtr.px);
      testing::Message::~Message(&local_2d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)local_2e8);
    this_00 = &gtest_ar_15.message_;
    shared_ptr<Struct>::shared_ptr
              ((shared_ptr<Struct> *)this_00,(shared_ptr<Struct> *)&gtest_ar.message_);
    shared_ptr<Struct>::operator=((shared_ptr<Struct> *)local_2e8,(shared_ptr<Struct> *)this_00);
    shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)this_00);
    local_309 = false;
    testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
              ((EqHelper<false> *)local_308,"false","xPtr",&local_309,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar2) {
      testing::Message::Message(&local_318);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x55,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    local_331 = false;
    local_332 = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_330,"false","xPtr.unique()",&local_331,&local_332);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar2) {
      testing::Message::Message(&local_340);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x56,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_340);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
      testing::Message::~Message(&local_340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    local_35c = 0;
    local_368 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_358,"0",(int *)"xPtr.use_count()",(long *)&local_35c,&local_368);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar2) {
      testing::Message::Message(&local_370);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x57,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_370);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    local_390 = (void *)0x0;
    local_398 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_388,"(void*)__null","xPtr.get()",&local_390,&local_398);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
    if (!bVar2) {
      testing::Message::Message(&local_3a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x58,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_3a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
    local_3b9 = false;
    local_3ba = shared_ptr<Struct>::unique((shared_ptr<Struct> *)local_2e8);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_3b8,"false","zPtr.unique()",&local_3b9,&local_3ba);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
    if (!bVar2) {
      testing::Message::Message(&local_3c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x59,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
      testing::Message::~Message(&local_3c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
    local_3e4 = 0;
    local_3f0 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)local_2e8);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_3e0,"0",(int *)"zPtr.use_count()",(long *)&local_3e4,&local_3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar2) {
      testing::Message::Message(&local_3f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_3f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    local_418 = (void *)0x0;
    local_420 = shared_ptr<Struct>::get((shared_ptr<Struct> *)local_2e8);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_410,"(void*)__null","zPtr.get()",&local_418,&local_420);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar2) {
      testing::Message::Message(&local_428);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_428);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
      testing::Message::~Message(&local_428);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)local_2e8);
    shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)&gtest_ar_8.message_);
    local_441 = false;
    testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
              ((EqHelper<false> *)local_440,"false","xPtr",&local_441,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
    if (!bVar2) {
      testing::Message::Message(&local_450);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_450);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
      testing::Message::~Message(&local_450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
    local_469 = false;
    local_46a = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_468,"false","xPtr.unique()",&local_469,&local_46a);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
    if (!bVar2) {
      testing::Message::Message(&local_478);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x60,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_478);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
      testing::Message::~Message(&local_478);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
    local_494 = 0;
    local_4a0 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<true>::Compare<int,long>
              (local_490,"0",(int *)"xPtr.use_count()",(long *)&local_494,&local_4a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
    if (!bVar2) {
      testing::Message::Message(&local_4a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x61,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
      testing::Message::~Message(&local_4a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
    local_4c8 = (void *)0x0;
    local_4d0 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<void*,Struct*>
              ((EqHelper<false> *)local_4c0,"(void*)__null","xPtr.get()",&local_4c8,&local_4d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
    if (!bVar2) {
      testing::Message::Message(&local_4d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&this_local,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x62,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&this_local,&local_4d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&this_local);
      testing::Message::~Message(&local_4d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  }
  shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)&gtest_ar.message_);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TEST(shared_ptr, empty_ptr)
{
    // Create an empty (ie. NULL) shared_ptr
    shared_ptr<Struct> xPtr;

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    if (xPtr)
    {
        GTEST_FATAL_FAILURE_("bool cast operator error");
    }

    // Reset to NULL (ie. do nothing)
    xPtr.reset();

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    // sub-scope
    {
        // Copy construct the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> yPtr(xPtr);

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, yPtr.unique());
        EXPECT_EQ(0,     yPtr.use_count());
        EXPECT_EQ((void*)NULL,  yPtr.get());

        // Assign the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> zPtr;
        zPtr = xPtr;

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, zPtr.unique());
        EXPECT_EQ(0,     zPtr.use_count());
        EXPECT_EQ((void*)NULL,  zPtr.get());
    }
    // end of scope

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());
}